

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aarect.h
# Opt level: O1

bool __thiscall yz_rect::hit(yz_rect *this,ray *r,double t0,double t1,hit_record *rec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = (this->k - (r->orig).e[0]) / (r->dir).e[0];
  if ((t0 <= dVar6) && (dVar6 <= t1)) {
    dVar3 = (r->dir).e[1] * dVar6 + (r->orig).e[1];
    dVar4 = this->y0;
    if ((dVar4 <= dVar3) && (dVar3 <= this->y1)) {
      dVar5 = (r->dir).e[2] * dVar6 + (r->orig).e[2];
      dVar1 = this->z0;
      if ((dVar1 <= dVar5) && (dVar2 = this->z1, dVar5 <= dVar2)) {
        rec->u = (dVar3 - dVar4) / (this->y1 - dVar4);
        rec->v = (dVar5 - dVar1) / (dVar2 - dVar1);
        rec->t = dVar6;
        dVar4 = 0.0;
        dVar3 = (r->dir).e[2] * 0.0 + (r->dir).e[1] * 0.0 + (r->dir).e[0];
        rec->front_face = dVar3 < 0.0;
        if (0.0 <= dVar3) {
          dVar4 = -0.0;
        }
        (rec->normal).e[0] = *(double *)(&DAT_00124040 + (ulong)(dVar3 < 0.0) * 8);
        (rec->normal).e[1] = dVar4;
        (rec->normal).e[2] = dVar4;
        (rec->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->mp).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(rec->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(this->mp).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        dVar4 = (r->dir).e[1];
        dVar3 = (r->dir).e[2];
        dVar1 = (r->orig).e[1];
        dVar5 = (r->orig).e[2];
        (rec->p).e[0] = (r->dir).e[0] * dVar6 + (r->orig).e[0];
        (rec->p).e[1] = dVar4 * dVar6 + dVar1;
        (rec->p).e[2] = dVar6 * dVar3 + dVar5;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool yz_rect::hit(const ray& r, double t0, double t1, hit_record& rec) const {
    auto t = (k-r.origin().x()) / r.direction().x();
    if (t < t0 || t > t1)
        return false;
    auto y = r.origin().y() + t*r.direction().y();
    auto z = r.origin().z() + t*r.direction().z();
    if (y < y0 || y > y1 || z < z0 || z > z1)
        return false;
    rec.u = (y-y0)/(y1-y0);
    rec.v = (z-z0)/(z1-z0);
    rec.t = t;
    vec3 outward_normal = vec3(1, 0, 0);
    rec.set_face_normal(r, outward_normal);
    rec.mat_ptr = mp;
    rec.p = r.at(t);
    return true;
}